

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O2

QRectF * __thiscall QLabelPrivate::layoutRect(QRectF *__return_storage_ptr__,QLabelPrivate *this)

{
  long *plVar1;
  double dVar2;
  double in_XMM1_Qa;
  qreal qVar3;
  double dVar4;
  QRect QVar5;
  
  QVar5 = documentRect(this);
  qVar3 = (qreal)QVar5.y1.m_i.m_i;
  dVar4 = (double)(((QVar5._8_8_ >> 0x20) - (QVar5._0_8_ >> 0x20)) + 1);
  if (this->control == (QWidgetTextControl *)0x0) goto LAB_003e543d;
  ensureTextLayouted(this);
  QWidgetTextControl::document((QWidgetTextControl *)this->control);
  plVar1 = (long *)QTextDocument::documentLayout();
  (**(code **)(*plVar1 + 0x78))(plVar1);
  if ((char)this->align < '\0') {
    in_XMM1_Qa = (dVar4 - in_XMM1_Qa) * 0.5;
LAB_003e542f:
    dVar2 = 0.0;
    if (0.0 <= in_XMM1_Qa) {
      dVar2 = in_XMM1_Qa;
    }
  }
  else {
    dVar2 = 0.0;
    if ((this->align & 0x40U) != 0) {
      in_XMM1_Qa = dVar4 - in_XMM1_Qa;
      goto LAB_003e542f;
    }
  }
  qVar3 = qVar3 + dVar2;
LAB_003e543d:
  __return_storage_ptr__->xp = (double)QVar5.x1.m_i.m_i;
  __return_storage_ptr__->yp = qVar3;
  __return_storage_ptr__->w = (double)(((long)QVar5.x2.m_i.m_i - (long)QVar5.x1.m_i.m_i) + 1);
  __return_storage_ptr__->h = dVar4;
  return __return_storage_ptr__;
}

Assistant:

QRectF QLabelPrivate::layoutRect() const
{
    QRectF cr = documentRect();
    if (!control)
        return cr;
    ensureTextLayouted();
    // Calculate y position manually
    qreal rh = control->document()->documentLayout()->documentSize().height();
    qreal yo = 0;
    if (align & Qt::AlignVCenter)
        yo = qMax((cr.height()-rh)/2, qreal(0));
    else if (align & Qt::AlignBottom)
        yo = qMax(cr.height()-rh, qreal(0));
    return QRectF(cr.x(), yo + cr.y(), cr.width(), cr.height());
}